

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diyfp.h
# Opt level: O0

void __thiscall rapidjson::internal::DiyFp::DiyFp(DiyFp *this,double d)

{
  uint uVar1;
  uint64_t significand;
  int biased_e;
  anon_union_8_2_f9ece1b0 u;
  double d_local;
  DiyFp *this_local;
  
  uVar1 = ((uint)((ulong)d >> 0x20) & 0x7ff00000) >> 0x14;
  if (uVar1 == 0) {
    this->f = (ulong)d & 0xfffffffffffff;
    this->e = -0x432;
  }
  else {
    this->f = ((ulong)d & 0xfffffffffffff) + 0x10000000000000;
    this->e = uVar1 - 0x433;
  }
  return;
}

Assistant:

explicit DiyFp(double d) {
        union {
            double d;
            uint64_t u64;
        } u = { d };

        int biased_e = static_cast<int>((u.u64 & kDpExponentMask) >> kDpSignificandSize);
        uint64_t significand = (u.u64 & kDpSignificandMask);
        if (biased_e != 0) {
            f = significand + kDpHiddenBit;
            e = biased_e - kDpExponentBias;
        } 
        else {
            f = significand;
            e = kDpMinExponent + 1;
        }
    }